

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

void __thiscall duckdb::WriteOverflowStringsToDisk::Flush(WriteOverflowStringsToDisk *this)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  idx_t iVar4;
  BlockManager *pBVar5;
  FileBuffer *pFVar6;
  
  if ((this->block_id != -1) && (uVar1 = this->offset, uVar1 != 0)) {
    iVar3 = GetStringSpace(this);
    if (uVar1 < iVar3) {
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
      pdVar2 = ((this->handle).node.ptr)->buffer;
      iVar3 = this->offset;
      iVar4 = GetStringSpace(this);
      switchD_01043a80::default(pdVar2 + iVar3,0,iVar4 - this->offset);
    }
    pBVar5 = PartialBlockManager::GetBlockManager(this->partial_block_manager);
    pFVar6 = BufferHandle::GetFileBuffer(&this->handle);
    (*pBVar5->_vptr_BlockManager[0xe])(pBVar5,pFVar6,this->block_id);
  }
  this->block_id = -1;
  this->offset = 0;
  return;
}

Assistant:

void WriteOverflowStringsToDisk::Flush() {
	if (block_id != INVALID_BLOCK && offset > 0) {
		// zero-initialize the empty part of the overflow string buffer (if any)
		if (offset < GetStringSpace()) {
			memset(handle.Ptr() + offset, 0, GetStringSpace() - offset);
		}
		// write to disk
		auto &block_manager = partial_block_manager.GetBlockManager();
		block_manager.Write(handle.GetFileBuffer(), block_id);
	}
	block_id = INVALID_BLOCK;
	offset = 0;
}